

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void gl4cts::EnhancedLayouts::Utils::VertexArray::Disable
               (Functions *gl,GLuint index,Type *type,GLuint n_array_elements)

{
  GLenum err;
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = type->m_n_columns;
  iVar2 = 0;
  do {
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      uVar3 = 1;
      do {
        (*gl->disableVertexAttribArray)((index + uVar3) - 1);
        err = (*gl->getError)();
        glu::checkError(err,"DisableVertexAttribArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xe51);
        uVar3 = uVar3 + 1;
        uVar1 = type->m_n_columns;
      } while (uVar3 <= uVar1);
      index = (index + uVar3) - 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != n_array_elements + (n_array_elements == 0));
  return;
}

Assistant:

void VertexArray::Disable(const Functions& gl, GLuint index, const Type& type, GLuint n_array_elements)
{
	/* If attribute is not an array */
	if (0 == n_array_elements)
	{
		n_array_elements = 1;
	}

	/* For each element in array */
	for (GLuint element = 0; element < n_array_elements; ++element)
	{
		/* For each column in matrix */
		for (GLuint column = 1; column <= type.m_n_columns; ++column)
		{
			/* Enable attribute array */
			gl.disableVertexAttribArray(index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");

			/* Next location */
			index += 1;
		}
	}
}